

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

char * TR_VarDec(ast *node,int *size)

{
  attr *a;
  char *pcVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _Elt_pointer piVar4;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  key_type local_b8;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  
  do {
    node = child(node,1);
  } while (node->type != 0x11c);
  a = findvar(node->lex);
  IrSim::newVar((Operand *)local_98,&irSim);
  pcVar1 = strdup(local_90._M_p);
  std::__cxx11::string::~string((string *)&local_90);
  if (a->kind == 0) {
    std::__cxx11::string::string((string *)local_98,node->lex,(allocator *)&local_d8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&basics_abi_cxx11_,(key_type *)local_98);
    std::__cxx11::string::assign((char *)pmVar3);
  }
  else {
    if (a->kind != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                    ,0x26d,"const char *TR_VarDec(ast *, int *)");
    }
    std::__cxx11::string::string((string *)&local_d8,pcVar1,&local_d9);
    Array::Array((Array *)local_98,&local_d8,a);
    std::__cxx11::string::string((string *)&local_b8,node->lex,&local_da);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
             ::operator[](&arrays_abi_cxx11_,&local_b8);
    Array::operator=(pmVar2,(Array *)local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    Array::~Array((Array *)local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    if (size == (int *)0x0) {
      return pcVar1;
    }
    std::__cxx11::string::string((string *)local_98,node->lex,(allocator *)&local_d8);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
             ::operator[](&arrays_abi_cxx11_,(key_type *)local_98);
    piVar4 = (pmVar2->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar4 == (pmVar2->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar4 = (pmVar2->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    *size = piVar4[-1];
  }
  std::__cxx11::string::~string((string *)local_98);
  return pcVar1;
}

Assistant:

static const char *TR_VarDec(ast *node, int *size) {
    ast *c1 = child(node, 1);
    while (c1->type != ID) c1 = child(c1, 1);
    attr *a = findvar(c1->lex);
    const char *name = strdup(irSim.newVar().value.c_str());
    if (a->kind == ARRAY) {
        arrays[c1->lex] = Array(name, a);
        if (size) *size = arrays[c1->lex].getSize();
    }
    else if (a->kind == BASIC) basics[c1->lex] = name;
    else assert(false);
    return name;
}